

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall
TPZFrontNonSym<double>::TensorProductIJ
          (TPZFrontNonSym<double> *this,int ithread,STensorProductMTData *data)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (data == (STensorProductMTData *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontNonSym.cpp"
               ,0x11a);
  }
  if (data->fRunning == true) {
    lVar10 = (long)ithread;
    do {
      TPZSemaphore::Wait((data->fWorkSem).fStore + lVar10);
      if (data->fRunning != true) {
        return;
      }
      iVar4 = (int)data->fAuxVecCol->fNElements;
      if (ithread < iVar4) {
        pdVar2 = data->fAuxVecRow->fStore;
        lVar5 = (long)(this->super_TPZFront<double>).fMaxFront;
        pdVar3 = data->fAuxVecCol->fStore;
        lVar6 = (long)(int)((ulong)((long)(data->fThreads).
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(data->fThreads).
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
        pdVar7 = (double *)(lVar10 * 8 * lVar5 + (long)(this->super_TPZFront<double>).fData.fStore);
        lVar8 = lVar10;
        do {
          if (0 < iVar4) {
            dVar1 = pdVar2[lVar8];
            lVar9 = 0;
            do {
              pdVar7[lVar9] = pdVar7[lVar9] - pdVar3[lVar9] * dVar1;
              lVar9 = lVar9 + 1;
            } while (iVar4 != (int)lVar9);
          }
          lVar8 = lVar8 + lVar6;
          pdVar7 = pdVar7 + lVar5 * lVar6;
        } while (lVar8 < iVar4);
      }
      TPZFront<double>::STensorProductMTData::WorkDone(data);
    } while (data->fRunning != false);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::TensorProductIJ(int ithread,typename TPZFront<TVar>::STensorProductMTData *data){
  if(!data) DebugStop();
  while(data->fRunning){
    data->fWorkSem[ithread].Wait();
    if(!data->fRunning) break;
    const int n = data->fAuxVecCol->NElements();
    const int Nthreads = data->NThreads();
		
    for(int j = 0 + ithread; j < n; j += Nthreads){
      const TVar RowVal = data->fAuxVecRow->operator[](j);
      int i = 0;
      TVar * ElemPtr = &(this->Element(i,j));
      TVar * ColValPtr = &(data->fAuxVecCol->operator[](i));
      for(; i < n; i++, ColValPtr++, ElemPtr++){
        (*ElemPtr) -=  (*ColValPtr) * RowVal;
      }///i
    }///j
    data->WorkDone();
  }///while
}